

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_suite.cpp
# Opt level: O2

void __thiscall parser_suite::test_path_plain::test_method(test_path_plain *this)

{
  view_type local_208;
  undefined8 *local_1f8;
  char *local_1f0;
  string_type local_1e8;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  parser parser;
  char input [26];
  
  local_208.ptr_ = input;
  builtin_strncpy(input + 0x10,".com/path",10);
  builtin_strncpy(input,"scheme://example",0x10);
  local_208.len_ = strlen(local_208.ptr_);
  trial::url::basic_parser<char>::basic_parser(&parser,&local_208);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x52);
  local_208.len_ = local_208.len_ & 0xffffffffffffff00;
  local_208.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_180 = "";
  trial::url::basic_parser<char>::scheme_abi_cxx11_(&local_1e8,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (&local_208,&local_188,0x52,2,2,&local_1e8,"parser.scheme()","scheme","\"scheme\"");
  std::__cxx11::string::~string((string *)&local_1e8);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x53);
  local_208.len_ = local_208.len_ & 0xffffffffffffff00;
  local_208.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_190 = "";
  trial::url::basic_parser<char>::authority_abi_cxx11_(&local_1e8,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (&local_208,&local_198,0x53,2,2,&local_1e8,"parser.authority()","example.com",
             "\"example.com\"");
  std::__cxx11::string::~string((string *)&local_1e8);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x54);
  local_208.len_ = local_208.len_ & 0xffffffffffffff00;
  local_208.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_1a0 = "";
  trial::url::basic_parser<char>::path_abi_cxx11_(&local_1e8,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (&local_208,&local_1a8,0x54,2,2,&local_1e8,"parser.path()","/path","\"/path\"");
  std::__cxx11::string::~string((string *)&local_1e8);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x55);
  local_208.len_ = local_208.len_ & 0xffffffffffffff00;
  local_208.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_1b0 = "";
  trial::url::basic_parser<char>::query_abi_cxx11_(&local_1e8,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_208,&local_1b8,0x55,2,2,&local_1e8,"parser.query()","","\"\"");
  std::__cxx11::string::~string((string *)&local_1e8);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x56);
  local_208.len_ = local_208.len_ & 0xffffffffffffff00;
  local_208.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_1c0 = "";
  trial::url::basic_parser<char>::fragment_abi_cxx11_(&local_1e8,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_208,&local_1c8,0x56,2,2,&local_1e8,"parser.fragment()","","\"\"");
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_plain)
{
    const char input[] = "scheme://example.com/path";
    url::parser parser(input);
    BOOST_REQUIRE_EQUAL(parser.scheme(), "scheme");
    BOOST_REQUIRE_EQUAL(parser.authority(), "example.com");
    BOOST_REQUIRE_EQUAL(parser.path(), "/path");
    BOOST_REQUIRE_EQUAL(parser.query(), "");
    BOOST_REQUIRE_EQUAL(parser.fragment(), "");
}